

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedFieldGenerator::FinishInitialization
          (RepeatedFieldGenerator *this)

{
  bool bVar1;
  mapped_type *this_00;
  allocator local_99;
  key_type local_98;
  string local_78;
  _Self local_58 [3];
  allocator local_39;
  key_type local_38;
  _Self local_18;
  RepeatedFieldGenerator *local_10;
  RepeatedFieldGenerator *this_local;
  
  local_10 = this;
  FieldGenerator::FinishInitialization((FieldGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"array_property_type",&local_39);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
               variables_,&local_38);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
              variables_);
  bVar1 = std::operator==(&local_18,local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    FieldGenerator::variable_abi_cxx11_(&local_78,(FieldGenerator *)this,"array_storage_type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"array_property_type",&local_99);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.
                            super_FieldGenerator.variables_,&local_98);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void RepeatedFieldGenerator::FinishInitialization(void) {
  FieldGenerator::FinishInitialization();
  if (variables_.find("array_property_type") == variables_.end()) {
    variables_["array_property_type"] = variable("array_storage_type");
  }
}